

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

void __thiscall llvm::DWARFContext::~DWARFContext(DWARFContext *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  function<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*)>
  *pfVar3;
  DWARFObject *pDVar4;
  MCRegisterInfo *__ptr;
  pointer pcVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Manager_type p_Var7;
  AppleAcceleratorTable *pAVar8;
  DWARFDebugNames *pDVar9;
  DWARFDebugAranges *__ptr_00;
  DWARFUnitIndex *pDVar10;
  DWARFGdbIndex *__ptr_01;
  int iVar11;
  
  (this->super_DIContext)._vptr_DIContext = (_func_int **)&PTR__DWARFContext_010980b8;
  pDVar4 = (this->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  if (pDVar4 != (DWARFObject *)0x0) {
    (*pDVar4->_vptr_DWARFObject[1])();
  }
  (this->DObj)._M_t.
  super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>._M_t
  .super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>.
  super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl = (DWARFObject *)0x0;
  __ptr = (this->RegInfo)._M_t.
          super___uniq_ptr_impl<llvm::MCRegisterInfo,_std::default_delete<llvm::MCRegisterInfo>_>.
          _M_t.
          super__Tuple_impl<0UL,_llvm::MCRegisterInfo_*,_std::default_delete<llvm::MCRegisterInfo>_>
          .super__Head_base<0UL,_llvm::MCRegisterInfo_*,_false>._M_head_impl;
  if (__ptr != (MCRegisterInfo *)0x0) {
    std::default_delete<llvm::MCRegisterInfo>::operator()
              ((default_delete<llvm::MCRegisterInfo> *)&this->RegInfo,__ptr);
  }
  (this->RegInfo)._M_t.
  super___uniq_ptr_impl<llvm::MCRegisterInfo,_std::default_delete<llvm::MCRegisterInfo>_>._M_t.
  super__Tuple_impl<0UL,_llvm::MCRegisterInfo_*,_std::default_delete<llvm::MCRegisterInfo>_>.
  super__Head_base<0UL,_llvm::MCRegisterInfo_*,_false>._M_head_impl = (MCRegisterInfo *)0x0;
  pcVar5 = (this->DWPName)._M_dataplus._M_p;
  paVar2 = &(this->DWPName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar2) {
    operator_delete(pcVar5,paVar2->_M_allocated_capacity + 1);
  }
  p_Var6 = (this->DWP).super___weak_ptr<llvm::DWARFContext::DWOFile,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var6->_M_weak_count;
      iVar11 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar11 = p_Var6->_M_weak_count;
      p_Var6->_M_weak_count = iVar11 + -1;
    }
    if (iVar11 == 1) {
      (*p_Var6->_vptr__Sp_counted_base[3])();
    }
  }
  StringMap<std::weak_ptr<llvm::DWARFContext::DWOFile>,_llvm::MallocAllocator>::~StringMap
            (&this->DWOFiles);
  std::unique_ptr<llvm::DWARFDebugAbbrev,_std::default_delete<llvm::DWARFDebugAbbrev>_>::~unique_ptr
            (&this->AbbrevDWO);
  p_Var7 = (this->DWOUnits).Parser.super__Function_base._M_manager;
  if (p_Var7 != (_Manager_type)0x0) {
    pfVar3 = &(this->DWOUnits).Parser;
    (*p_Var7)((_Any_data *)pfVar3,(_Any_data *)pfVar3,__destroy_functor);
  }
  SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>::
  ~SmallVector(&(this->DWOUnits).
                super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              );
  pAVar8 = (this->AppleObjC)._M_t.
           super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
           .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl;
  if (pAVar8 != (AppleAcceleratorTable *)0x0) {
    (**(code **)((long)(pAVar8->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable + 8))();
  }
  (this->AppleObjC)._M_t.
  super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
  .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl =
       (AppleAcceleratorTable *)0x0;
  pAVar8 = (this->AppleNamespaces)._M_t.
           super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
           .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl;
  if (pAVar8 != (AppleAcceleratorTable *)0x0) {
    (**(code **)((long)(pAVar8->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable + 8))();
  }
  (this->AppleNamespaces)._M_t.
  super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
  .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl =
       (AppleAcceleratorTable *)0x0;
  pAVar8 = (this->AppleTypes)._M_t.
           super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
           .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl;
  if (pAVar8 != (AppleAcceleratorTable *)0x0) {
    (**(code **)((long)(pAVar8->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable + 8))();
  }
  (this->AppleTypes)._M_t.
  super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
  .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl =
       (AppleAcceleratorTable *)0x0;
  pAVar8 = (this->AppleNames)._M_t.
           super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
           .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl;
  if (pAVar8 != (AppleAcceleratorTable *)0x0) {
    (**(code **)((long)(pAVar8->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable + 8))();
  }
  (this->AppleNames)._M_t.
  super___uniq_ptr_impl<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_llvm::AppleAcceleratorTable_*,_std::default_delete<llvm::AppleAcceleratorTable>_>
  .super__Head_base<0UL,_llvm::AppleAcceleratorTable_*,_false>._M_head_impl =
       (AppleAcceleratorTable *)0x0;
  pDVar9 = (this->Names)._M_t.
           super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>
           .super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl;
  if (pDVar9 != (DWARFDebugNames *)0x0) {
    (**(code **)((long)(pDVar9->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable + 8))();
  }
  (this->Names)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>.
  super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl = (DWARFDebugNames *)0x0;
  std::unique_ptr<llvm::DWARFDebugMacro,_std::default_delete<llvm::DWARFDebugMacro>_>::~unique_ptr
            (&this->Macro);
  std::unique_ptr<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>::~unique_ptr
            (&this->EHFrame);
  std::unique_ptr<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>::~unique_ptr
            (&this->DebugFrame);
  std::unique_ptr<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_>::~unique_ptr
            (&this->Line);
  __ptr_00 = (this->Aranges)._M_t.
             super___uniq_ptr_impl<llvm::DWARFDebugAranges,_std::default_delete<llvm::DWARFDebugAranges>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFDebugAranges_*,_std::default_delete<llvm::DWARFDebugAranges>_>
             .super__Head_base<0UL,_llvm::DWARFDebugAranges_*,_false>._M_head_impl;
  if (__ptr_00 != (DWARFDebugAranges *)0x0) {
    std::default_delete<llvm::DWARFDebugAranges>::operator()
              ((default_delete<llvm::DWARFDebugAranges> *)&this->Aranges,__ptr_00);
  }
  (this->Aranges)._M_t.
  super___uniq_ptr_impl<llvm::DWARFDebugAranges,_std::default_delete<llvm::DWARFDebugAranges>_>._M_t
  .super__Tuple_impl<0UL,_llvm::DWARFDebugAranges_*,_std::default_delete<llvm::DWARFDebugAranges>_>.
  super__Head_base<0UL,_llvm::DWARFDebugAranges_*,_false>._M_head_impl = (DWARFDebugAranges *)0x0;
  std::unique_ptr<llvm::DWARFDebugLoc,_std::default_delete<llvm::DWARFDebugLoc>_>::~unique_ptr
            (&this->Loc);
  std::unique_ptr<llvm::DWARFDebugAbbrev,_std::default_delete<llvm::DWARFDebugAbbrev>_>::~unique_ptr
            (&this->Abbrev);
  pDVar10 = (this->TUIndex)._M_t.
            super___uniq_ptr_impl<llvm::DWARFUnitIndex,_std::default_delete<llvm::DWARFUnitIndex>_>.
            _M_t.
            super__Tuple_impl<0UL,_llvm::DWARFUnitIndex_*,_std::default_delete<llvm::DWARFUnitIndex>_>
            .super__Head_base<0UL,_llvm::DWARFUnitIndex_*,_false>._M_head_impl;
  if (pDVar10 != (DWARFUnitIndex *)0x0) {
    std::default_delete<llvm::DWARFUnitIndex>::operator()
              ((default_delete<llvm::DWARFUnitIndex> *)&this->TUIndex,pDVar10);
  }
  (this->TUIndex)._M_t.
  super___uniq_ptr_impl<llvm::DWARFUnitIndex,_std::default_delete<llvm::DWARFUnitIndex>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFUnitIndex_*,_std::default_delete<llvm::DWARFUnitIndex>_>.
  super__Head_base<0UL,_llvm::DWARFUnitIndex_*,_false>._M_head_impl = (DWARFUnitIndex *)0x0;
  __ptr_01 = (this->GdbIndex)._M_t.
             super___uniq_ptr_impl<llvm::DWARFGdbIndex,_std::default_delete<llvm::DWARFGdbIndex>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::DWARFGdbIndex_*,_std::default_delete<llvm::DWARFGdbIndex>_>
             .super__Head_base<0UL,_llvm::DWARFGdbIndex_*,_false>._M_head_impl;
  if (__ptr_01 != (DWARFGdbIndex *)0x0) {
    std::default_delete<llvm::DWARFGdbIndex>::operator()
              ((default_delete<llvm::DWARFGdbIndex> *)&this->GdbIndex,__ptr_01);
  }
  (this->GdbIndex)._M_t.
  super___uniq_ptr_impl<llvm::DWARFGdbIndex,_std::default_delete<llvm::DWARFGdbIndex>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFGdbIndex_*,_std::default_delete<llvm::DWARFGdbIndex>_>.
  super__Head_base<0UL,_llvm::DWARFGdbIndex_*,_false>._M_head_impl = (DWARFGdbIndex *)0x0;
  pDVar10 = (this->CUIndex)._M_t.
            super___uniq_ptr_impl<llvm::DWARFUnitIndex,_std::default_delete<llvm::DWARFUnitIndex>_>.
            _M_t.
            super__Tuple_impl<0UL,_llvm::DWARFUnitIndex_*,_std::default_delete<llvm::DWARFUnitIndex>_>
            .super__Head_base<0UL,_llvm::DWARFUnitIndex_*,_false>._M_head_impl;
  if (pDVar10 != (DWARFUnitIndex *)0x0) {
    std::default_delete<llvm::DWARFUnitIndex>::operator()
              ((default_delete<llvm::DWARFUnitIndex> *)&this->CUIndex,pDVar10);
  }
  (this->CUIndex)._M_t.
  super___uniq_ptr_impl<llvm::DWARFUnitIndex,_std::default_delete<llvm::DWARFUnitIndex>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFUnitIndex_*,_std::default_delete<llvm::DWARFUnitIndex>_>.
  super__Head_base<0UL,_llvm::DWARFUnitIndex_*,_false>._M_head_impl = (DWARFUnitIndex *)0x0;
  p_Var7 = (this->NormalUnits).Parser.super__Function_base._M_manager;
  if (p_Var7 != (_Manager_type)0x0) {
    pfVar3 = &(this->NormalUnits).Parser;
    (*p_Var7)((_Any_data *)pfVar3,(_Any_data *)pfVar3,__destroy_functor);
  }
  SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>::
  ~SmallVector(&(this->NormalUnits).
                super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              );
  return;
}

Assistant:

DWARFContext::~DWARFContext() = default;